

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O0

void __thiscall
soul::
Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>::
initialise(Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
           *this,CodeLocation *code)

{
  CodeLocation *code_local;
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  *this_local;
  
  CodeLocation::operator=(&this->startLocation,code);
  CodeLocation::operator=(&this->location,code);
  UTF8Reader::operator=(&this->input,&(this->location).location);
  skip(this);
  return;
}

Assistant:

void initialise (const CodeLocation& code)
    {
        startLocation = code;
        location = code;
        input = location.location;
        skip();
    }